

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void kmp_set_blocktime_(int *arg)

{
  int tid_00;
  kmp_info_t *in_RDI;
  kmp_info_t *thread;
  int tid;
  int gtid;
  
  tid_00 = __kmp_get_global_thread_id_reg();
  __kmp_aux_set_blocktime(thread._4_4_,in_RDI,tid_00);
  return;
}

Assistant:

void FTN_STDCALL FTN_SET_BLOCKTIME(int KMP_DEREF arg) {
#ifdef KMP_STUB
  __kmps_set_blocktime(KMP_DEREF arg);
#else
  int gtid, tid;
  kmp_info_t *thread;

  gtid = __kmp_entry_gtid();
  tid = __kmp_tid_from_gtid(gtid);
  thread = __kmp_thread_from_gtid(gtid);

  __kmp_aux_set_blocktime(KMP_DEREF arg, thread, tid);
#endif
}